

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretIfelse
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  byte bVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  int iVar4;
  Trace *this_00;
  value_type *__x;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  CharStringOperand valueB;
  CharStringOperand valueA;
  _List_node_base *local_58;
  anon_union_8_2_3d487603_for_CharStringOperand_1 aStack_50;
  _List_node_base *local_48;
  anon_union_8_2_3d487603_for_CharStringOperand_1 aStack_40;
  
  __x = (value_type *)&local_58;
  iVar4 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x27])
                    (this->mImplementationHelper,this);
  if (iVar4 != 0) {
    return (Byte *)0x0;
  }
  if ((this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
      _M_impl._M_node._M_size < 4) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting"
                      ,(this->mOperandStack).
                       super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                       _M_impl._M_node._M_size);
    return (Byte *)0x0;
  }
  p_Var3 = (this->mOperandStack).
           super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  bVar1 = *(byte *)&p_Var3[1]._M_next;
  p_Var3 = p_Var3[1]._M_prev;
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
            (&this->mOperandStack);
  p_Var6 = (this->mOperandStack).
           super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  bVar2 = *(byte *)&p_Var6[1]._M_next;
  p_Var6 = p_Var6[1]._M_prev;
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
            (&this->mOperandStack);
  p_Var5 = (this->mOperandStack).
           super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  local_58 = p_Var5[1]._M_next;
  aStack_50 = (anon_union_8_2_3d487603_for_CharStringOperand_1)p_Var5[1]._M_prev;
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
            (&this->mOperandStack);
  p_Var5 = (this->mOperandStack).
           super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  local_48 = p_Var5[1]._M_next;
  aStack_40 = (anon_union_8_2_3d487603_for_CharStringOperand_1)p_Var5[1]._M_prev;
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
            (&this->mOperandStack);
  if ((bVar2 & bVar1 & 1) == 0) {
    p_Var5 = p_Var3;
    if ((bVar1 & 1) != 0) {
      p_Var5 = (_List_node_base *)(double)(long)p_Var3;
    }
    if ((bVar2 & 1) != 0) {
      p_Var6 = (_List_node_base *)(double)(long)p_Var6;
      p_Var5 = p_Var3;
    }
    if ((double)p_Var5 < (double)p_Var6) goto LAB_001786a8;
  }
  else {
    __x = (value_type *)&local_58;
    if ((long)p_Var3 < (long)p_Var6) goto LAB_001786a8;
  }
  __x = (value_type *)&local_48;
LAB_001786a8:
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
            (&this->mOperandStack,__x);
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretIfelse(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Ifelse(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand valueC;
	CharStringOperand valueD;

	if(mOperandStack.size() < 4) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}		

	valueD = mOperandStack.back();
	mOperandStack.pop_back();
	valueC = mOperandStack.back();
	mOperandStack.pop_back();
	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	if(!valueC.IsInteger || !valueD.IsInteger)
	{
		if((valueC.IsInteger ? (double)valueC.IntegerValue : valueC.RealValue) >
			(valueD.IsInteger ? (double)valueD.IntegerValue : valueD.RealValue))
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}
	else
	{
		if(valueC.IntegerValue > valueD.IntegerValue)
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}

	return inProgramCounter;
}